

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

vector<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_> * __thiscall
kratos::PortPackedVisitor::structs
          (vector<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_>
           *__return_storage_ptr__,PortPackedVisitor *this)

{
  bool bVar1;
  reference __in;
  type *ppPVar2;
  type *s;
  type *_;
  _Self local_68;
  const_iterator __end2;
  const_iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_kratos::PackedStruct_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_kratos::PackedStruct_*>_>_>
  *__range2;
  PackedStructGraph g;
  PortPackedVisitor *this_local;
  
  g.nodes_._M_h._M_single_bucket = (__node_base_ptr)this;
  PackedStructGraph::PackedStructGraph((PackedStructGraph *)&__range2);
  __end2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_kratos::PackedStruct_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_kratos::PackedStruct_*>_>_>
           ::begin(&this->structs_);
  local_68._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_kratos::PackedStruct_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_kratos::PackedStruct_*>_>_>
       ::end(&this->structs_);
  while( true ) {
    bVar1 = std::operator!=(&__end2,&local_68);
    if (!bVar1) break;
    __in = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_kratos::PackedStruct_*>_>
           ::operator*(&__end2);
    std::get<0ul,std::__cxx11::string_const,kratos::PackedStruct_const*>(__in);
    ppPVar2 = std::get<1ul,std::__cxx11::string_const,kratos::PackedStruct_const*>(__in);
    add_struct((PackedStructGraph *)&__range2,(PackedStruct *)0x0,*ppPVar2);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_kratos::PackedStruct_*>_>
    ::operator++(&__end2);
  }
  PackedStructGraph::get_structs(__return_storage_ptr__,(PackedStructGraph *)&__range2);
  PackedStructGraph::~PackedStructGraph((PackedStructGraph *)&__range2);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] std::vector<const PackedStruct*> structs() const {
        PackedStructGraph g;
        for (auto const& [_, s] : structs_) {
            add_struct(&g, nullptr, s);
        }

        return g.get_structs();
    }